

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void Curl_hash_clean_with_criterium(curl_hash *h,void *user,_func_int_void_ptr_void_ptr *comp)

{
  curl_llist *pcVar1;
  curl_llist_element *pcVar2;
  int iVar3;
  long lVar4;
  curl_llist_element *e;
  
  if ((h != (curl_hash *)0x0) && (iVar3 = h->slots, 0 < iVar3)) {
    lVar4 = 0;
    do {
      pcVar1 = h->table;
      e = pcVar1[lVar4].head;
      if (e != (curl_llist_element *)0x0) {
        do {
          pcVar2 = e->next;
          if ((comp == (_func_int_void_ptr_void_ptr *)0x0) ||
             (iVar3 = (*comp)(user,*(void **)((long)e->ptr + 0x18)), iVar3 != 0)) {
            Curl_llist_remove(pcVar1 + lVar4,e,h);
            h->size = h->size - 1;
          }
          e = pcVar2;
        } while (pcVar2 != (curl_llist_element *)0x0);
        iVar3 = h->slots;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

void
Curl_hash_clean_with_criterium(struct curl_hash *h, void *user,
                               int (*comp)(void *, void *))
{
  struct curl_llist_element *le;
  struct curl_llist_element *lnext;
  struct curl_llist *list;
  int i;

  if(!h)
    return;

  for(i = 0; i < h->slots; ++i) {
    list = &h->table[i];
    le = list->head; /* get first list entry */
    while(le) {
      struct curl_hash_element *he = le->ptr;
      lnext = le->next;
      /* ask the callback function if we shall remove this entry or not */
      if(comp == NULL || comp(user, he->ptr)) {
        Curl_llist_remove(list, le, (void *) h);
        --h->size; /* one less entry in the hash now */
      }
      le = lnext;
    }
  }
}